

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

void png_colorspace_set_rgb_coefficients(png_structrp png_ptr)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *error_message;
  int iVar6;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  if (png_ptr->rgb_to_gray_coefficients_set != '\0') {
    return;
  }
  if (((png_ptr->colorspace).flags & 2) == 0) {
    return;
  }
  local_2c = (png_ptr->colorspace).end_points_XYZ.red_Y;
  uVar4 = (png_ptr->colorspace).end_points_XYZ.green_Y;
  uVar3 = (png_ptr->colorspace).end_points_XYZ.blue_Y;
  local_34 = uVar3;
  local_30 = uVar4;
  if ((((((-1 < (int)local_2c) && (iVar6 = uVar4 + local_2c + uVar3, 0 < iVar6)) &&
        (iVar1 = png_muldiv((png_fixed_point_p)&local_2c,local_2c,0x8000,iVar6), uVar5 = local_2c,
        -1 < (int)uVar4)) && ((iVar1 != 0 && (local_2c < 0x8001)))) &&
      ((iVar1 = png_muldiv((png_fixed_point_p)&local_30,uVar4,0x8000,iVar6), uVar4 = local_30,
       -1 < (int)uVar3 && ((iVar1 != 0 && (local_30 < 0x8001)))))) &&
     ((iVar6 = png_muldiv((png_fixed_point_p)&local_34,uVar3,0x8000,iVar6), iVar6 != 0 &&
      (local_34 < 0x8001)))) {
    uVar3 = uVar4 + uVar5 + local_34;
    if (uVar3 < 0x8002) {
      uVar2 = local_34;
      if (uVar3 == 0x8001) {
        iVar6 = -1;
LAB_00277521:
        if (uVar4 < local_34 || uVar4 < uVar5) {
          if (uVar5 < local_34 || uVar5 < uVar4) {
            uVar2 = local_34 + iVar6;
          }
          else {
            uVar5 = iVar6 + uVar5;
          }
        }
        else {
          uVar4 = iVar6 + uVar4;
        }
      }
      else if (uVar3 < 0x8000) {
        iVar6 = 1;
        goto LAB_00277521;
      }
      if (uVar2 + uVar4 + uVar5 == 0x8000) {
        png_ptr->rgb_to_gray_red_coeff = (png_uint_16)uVar5;
        png_ptr->rgb_to_gray_green_coeff = (png_uint_16)uVar4;
        return;
      }
      error_message = "internal error handling cHRM coefficients";
      goto LAB_00277589;
    }
  }
  error_message = "internal error handling cHRM->XYZ";
LAB_00277589:
  png_error(png_ptr,error_message);
}

Assistant:

void /* PRIVATE */
png_colorspace_set_rgb_coefficients(png_structrp png_ptr)
{
   /* Set the rgb_to_gray coefficients from the colorspace. */
   if (png_ptr->rgb_to_gray_coefficients_set == 0 &&
      (png_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_ENDPOINTS) != 0)
   {
      /* png_set_background has not been called, get the coefficients from the Y
       * values of the colorspace colorants.
       */
      png_fixed_point r = png_ptr->colorspace.end_points_XYZ.red_Y;
      png_fixed_point g = png_ptr->colorspace.end_points_XYZ.green_Y;
      png_fixed_point b = png_ptr->colorspace.end_points_XYZ.blue_Y;
      png_fixed_point total = r+g+b;

      if (total > 0 &&
         r >= 0 && png_muldiv(&r, r, 32768, total) && r >= 0 && r <= 32768 &&
         g >= 0 && png_muldiv(&g, g, 32768, total) && g >= 0 && g <= 32768 &&
         b >= 0 && png_muldiv(&b, b, 32768, total) && b >= 0 && b <= 32768 &&
         r+g+b <= 32769)
      {
         /* We allow 0 coefficients here.  r+g+b may be 32769 if two or
          * all of the coefficients were rounded up.  Handle this by
          * reducing the *largest* coefficient by 1; this matches the
          * approach used for the default coefficients in pngrtran.c
          */
         int add = 0;

         if (r+g+b > 32768)
            add = -1;
         else if (r+g+b < 32768)
            add = 1;

         if (add != 0)
         {
            if (g >= r && g >= b)
               g += add;
            else if (r >= g && r >= b)
               r += add;
            else
               b += add;
         }

         /* Check for an internal error. */
         if (r+g+b != 32768)
            png_error(png_ptr,
                "internal error handling cHRM coefficients");

         else
         {
            png_ptr->rgb_to_gray_red_coeff   = (png_uint_16)r;
            png_ptr->rgb_to_gray_green_coeff = (png_uint_16)g;
         }
      }

      /* This is a png_error at present even though it could be ignored -
       * it should never happen, but it is important that if it does, the
       * bug is fixed.
       */
      else
         png_error(png_ptr, "internal error handling cHRM->XYZ");
   }
}